

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O0

int xmlTextWriterStartElement(xmlTextWriterPtr writer,xmlChar *name)

{
  int iVar1;
  int iVar2;
  xmlLinkPtr lk_00;
  void *pvVar3;
  long *data;
  xmlChar *pxVar4;
  xmlTextWriterStackEntry *p;
  xmlLinkPtr lk;
  int sum;
  int count;
  xmlChar *name_local;
  xmlTextWriterPtr writer_local;
  
  if (((writer == (xmlTextWriterPtr)0x0) || (name == (xmlChar *)0x0)) || (*name == '\0')) {
    return -1;
  }
  lk._0_4_ = 0;
  lk_00 = xmlListFront(writer->nodes);
  if ((lk_00 != (xmlLinkPtr)0x0) && (pvVar3 = xmlLinkGetData(lk_00), pvVar3 != (void *)0x0)) {
    switch(*(undefined4 *)((long)pvVar3 + 8)) {
    case 0:
      break;
    case 2:
      lk._0_4_ = xmlTextWriterEndAttribute(writer);
      if ((int)lk < 0) {
        return -1;
      }
    case 1:
      iVar1 = xmlTextWriterOutputNSDecl(writer);
      if (iVar1 < 0) {
        return -1;
      }
      iVar2 = xmlOutputBufferWriteString(writer->out,">");
      if (iVar2 < 0) {
        return -1;
      }
      lk._0_4_ = iVar2 + iVar1 + (int)lk;
      if (writer->indent != 0) {
        xmlOutputBufferWriteString(writer->out,"\n");
      }
      *(undefined4 *)((long)pvVar3 + 8) = 3;
      break;
    default:
      break;
    case 4:
    case 5:
      return -1;
    }
  }
  data = (long *)(*xmlMalloc)(0x10);
  if (data == (long *)0x0) {
    xmlWriterErrMsg(writer,XML_ERR_NO_MEMORY,"xmlTextWriterStartElement : out of memory!\n");
    writer_local._4_4_ = -1;
  }
  else {
    pxVar4 = xmlStrdup(name);
    *data = (long)pxVar4;
    if (*data == 0) {
      xmlWriterErrMsg(writer,XML_ERR_NO_MEMORY,"xmlTextWriterStartElement : out of memory!\n");
      (*xmlFree)(data);
      writer_local._4_4_ = -1;
    }
    else {
      *(undefined4 *)(data + 1) = 1;
      xmlListPushFront(writer->nodes,data);
      if (writer->indent != 0) {
        iVar1 = xmlTextWriterWriteIndent(writer);
        lk._0_4_ = iVar1 + (int)lk;
      }
      iVar1 = xmlOutputBufferWriteString(writer->out,"<");
      if (iVar1 < 0) {
        writer_local._4_4_ = -1;
      }
      else {
        iVar2 = xmlOutputBufferWriteString(writer->out,(char *)*data);
        if (iVar2 < 0) {
          writer_local._4_4_ = -1;
        }
        else {
          writer_local._4_4_ = iVar2 + iVar1 + (int)lk;
        }
      }
    }
  }
  return writer_local._4_4_;
}

Assistant:

int
xmlTextWriterStartElement(xmlTextWriterPtr writer, const xmlChar * name)
{
    int count;
    int sum;
    xmlLinkPtr lk;
    xmlTextWriterStackEntry *p;

    if ((writer == NULL) || (name == NULL) || (*name == '\0'))
        return -1;

    sum = 0;
    lk = xmlListFront(writer->nodes);
    if (lk != 0) {
        p = (xmlTextWriterStackEntry *) xmlLinkGetData(lk);
        if (p != 0) {
            switch (p->state) {
                case XML_TEXTWRITER_PI:
                case XML_TEXTWRITER_PI_TEXT:
                    return -1;
                case XML_TEXTWRITER_NONE:
                    break;
				case XML_TEXTWRITER_ATTRIBUTE:
					count = xmlTextWriterEndAttribute(writer);
					if (count < 0)
						return -1;
					sum += count;
					/* fallthrough */
                case XML_TEXTWRITER_NAME:
                    /* Output namespace declarations */
                    count = xmlTextWriterOutputNSDecl(writer);
                    if (count < 0)
                        return -1;
                    sum += count;
                    count = xmlOutputBufferWriteString(writer->out, ">");
                    if (count < 0)
                        return -1;
                    sum += count;
                    if (writer->indent)
                        count =
                            xmlOutputBufferWriteString(writer->out, "\n");
                    p->state = XML_TEXTWRITER_TEXT;
                    break;
                default:
                    break;
            }
        }
    }

    p = (xmlTextWriterStackEntry *)
        xmlMalloc(sizeof(xmlTextWriterStackEntry));
    if (p == 0) {
        xmlWriterErrMsg(writer, XML_ERR_NO_MEMORY,
                        "xmlTextWriterStartElement : out of memory!\n");
        return -1;
    }

    p->name = xmlStrdup(name);
    if (p->name == 0) {
        xmlWriterErrMsg(writer, XML_ERR_NO_MEMORY,
                        "xmlTextWriterStartElement : out of memory!\n");
        xmlFree(p);
        return -1;
    }
    p->state = XML_TEXTWRITER_NAME;

    xmlListPushFront(writer->nodes, p);

    if (writer->indent) {
        count = xmlTextWriterWriteIndent(writer);
        sum += count;
    }

    count = xmlOutputBufferWriteString(writer->out, "<");
    if (count < 0)
        return -1;
    sum += count;
    count =
        xmlOutputBufferWriteString(writer->out, (const char *) p->name);
    if (count < 0)
        return -1;
    sum += count;

    return sum;
}